

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O1

Query * plan_qstring(Query *__return_storage_ptr__,
                    unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
                    *types_to_query,QString *value)

{
  Query *pQVar1;
  optional<unsigned_int> oVar2;
  ulong uVar3;
  int iVar4;
  int index;
  int iVar5;
  vector<Query,_std::allocator<Query>_> plan;
  PrimitiveQuery local_80;
  vector<Query,_std::allocator<Query>_> local_78;
  Query *local_58;
  size_type local_50;
  size_type local_48;
  size_type local_40;
  size_type local_38;
  
  local_78.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_80.itype = GRAM3;
  local_50 = std::
             _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&types_to_query->_M_h,&local_80.itype);
  local_80.itype = TEXT4;
  local_40 = std::
             _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&types_to_query->_M_h,&local_80.itype);
  local_80.itype = WIDE8;
  local_58 = __return_storage_ptr__;
  local_38 = std::
             _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&types_to_query->_M_h,&local_80.itype);
  local_80.itype = HASH4;
  local_48 = std::
             _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&types_to_query->_M_h,&local_80.itype);
  if (2 < (ulong)(((long)(value->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(value->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
    index = 0;
    iVar5 = 2;
    iVar4 = 0;
    do {
      if (local_38 == 0) {
LAB_00152620:
        if (local_40 != 0) {
          oVar2 = convert_gram(TEXT4,index,value);
          if (((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
            local_80.itype = TEXT4;
            local_80.trigram =
                 oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_payload;
            std::vector<Query,_std::allocator<Query>_>::emplace_back<PrimitiveQuery>
                      (&local_78,&local_80);
            iVar4 = index + 2;
            index = index + 1;
          }
          if (((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int> & 0x100000000) != 0)
          goto LAB_001526f6;
        }
        oVar2 = convert_gram(HASH4,index,value);
        if ((iVar4 + -1 <= index && local_48 != 0) &&
            ((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
          local_80.itype = HASH4;
          local_80.trigram =
               oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload;
          std::vector<Query,_std::allocator<Query>_>::emplace_back<PrimitiveQuery>
                    (&local_78,&local_80);
        }
        oVar2 = convert_gram(GRAM3,index,value);
        if (((iVar4 <= index) && (local_50 != 0)) &&
           (((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0x100000000) != 0)) {
          local_80.itype = GRAM3;
          local_80.trigram =
               oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload;
          std::vector<Query,_std::allocator<Query>_>::emplace_back<PrimitiveQuery>
                    (&local_78,&local_80);
        }
        index = index + 1;
      }
      else {
        oVar2 = convert_gram(WIDE8,index,value);
        if (((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
          local_80.itype = WIDE8;
          local_80.trigram =
               oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload;
          std::vector<Query,_std::allocator<Query>_>::emplace_back<PrimitiveQuery>
                    (&local_78,&local_80);
          iVar4 = index + 6;
          index = iVar5;
        }
        if (((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0x100000000) == 0)
        goto LAB_00152620;
      }
LAB_001526f6:
      iVar5 = index + 2;
      uVar3 = ((long)(value->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(value->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while ((ulong)(long)iVar5 <= uVar3 && uVar3 - (long)iVar5 != 0);
  }
  pQVar1 = local_58;
  local_58->type = AND;
  (local_58->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_58->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_58->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_58->ngram).itype = GRAM3;
  (local_58->ngram).trigram = 0;
  local_58->count = 0;
  (local_58->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (local_58->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (local_58->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_78.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<Query,_std::allocator<Query>_>::~vector(&local_78);
  return pQVar1;
}

Assistant:

Query plan_qstring(const std::unordered_set<IndexType> &types_to_query,
                   const QString &value) {
    std::vector<Query> plan;

    bool has_gram3 = types_to_query.count(IndexType::GRAM3) != 0;
    bool has_text4 = types_to_query.count(IndexType::TEXT4) != 0;
    bool has_wide8 = types_to_query.count(IndexType::WIDE8) != 0;
    bool has_hash4 = types_to_query.count(IndexType::HASH4) != 0;

    // `i` is the current index. `skip_to` is used to keep track of last
    // "handled" byte. For example there's no point in adding 3gram "bcd"
    // when 4gram "abcd" was already added. Only relevant for wide8 ngrams.
    int i = 0;
    int skip_to = 0;
    while (i + 2 < value.size()) {
        // If wide8 index is supported, try to add a token and skip 6 bytes.
        if (has_wide8) {
            if (const auto &gram = convert_gram(IndexType::WIDE8, i, value)) {
                plan.emplace_back(PrimitiveQuery(IndexType::WIDE8, *gram));
                skip_to = i + 6;
                i += 2;
                continue;
            }
        }
        // If text4 index is supported, try to add a token and skip 2 bytes.
        if (has_text4) {
            if (const auto &gram = convert_gram(IndexType::TEXT4, i, value)) {
                plan.emplace_back(PrimitiveQuery(IndexType::TEXT4, *gram));
                skip_to = i + 2;
                i += 1;
                continue;
            }
        }
        // If hash4 index is supported and current ngram is not text, try hash4.
        const auto &hgram = convert_gram(IndexType::HASH4, i, value);
        if (i >= (skip_to - 1) && has_hash4 && hgram) {
            plan.emplace_back(PrimitiveQuery(IndexType::HASH4, *hgram));
            // Don't continue here - gram3 can give us more information.
        }
        // Otherwise, add a regular gram3 token.
        const auto &gram = convert_gram(IndexType::GRAM3, i, value);
        if (i >= skip_to && gram) {
            if (has_gram3) {
                plan.emplace_back(PrimitiveQuery(IndexType::GRAM3, *gram));
            }
            i += 1;
            continue;
        }
        // If no ngram can be added, remember to move forward.
        i += 1;
    }

    return q_and(std::move(plan));
}